

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_pkt.cc
# Opt level: O0

ssl_open_record_t __thiscall
bssl::tls_open_change_cipher_spec
          (bssl *this,SSL *ssl,size_t *out_consumed,uint8_t *out_alert,Span<unsigned_char> in)

{
  Span<unsigned_char> in_00;
  size_t sVar1;
  uchar *puVar2;
  Span<const_unsigned_char> in_01;
  int local_78 [2];
  uchar *local_70;
  uint8_t *local_68;
  uchar *local_60;
  ssl_open_record_t local_54;
  undefined1 local_50 [4];
  ssl_open_record_t ret;
  Span<unsigned_char> body;
  uint8_t type;
  uint8_t *out_alert_local;
  size_t *out_consumed_local;
  SSL *ssl_local;
  Span<unsigned_char> in_local;
  
  Span<unsigned_char>::Span((Span<unsigned_char> *)local_50);
  in_00.size_ = (size_t)in.data_;
  in_00.data_ = out_alert;
  local_68 = out_alert;
  local_60 = in.data_;
  local_54 = tls_open_record((SSL *)this,(uint8_t *)((long)&body.size_ + 7),
                             (Span<unsigned_char> *)local_50,(size_t *)ssl,(uint8_t *)out_consumed,
                             in_00);
  in_local.size_._4_4_ = local_54;
  if (local_54 == ssl_open_record_success) {
    if (body.size_._7_1_ == '\x14') {
      sVar1 = Span<unsigned_char>::size((Span<unsigned_char> *)local_50);
      if ((sVar1 == 1) &&
         (puVar2 = Span<unsigned_char>::operator[]((Span<unsigned_char> *)local_50,0),
         *puVar2 == '\x01')) {
        Span<unsigned_char_const>::Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
                  ((Span<unsigned_char_const> *)local_78,(Span<unsigned_char> *)local_50);
        in_01.size_ = (size_t)out_alert;
        in_01.data_ = local_70;
        ssl_do_msg_callback(this,(SSL *)0x0,0x14,local_78[0],in_01);
        in_local.size_._4_4_ = ssl_open_record_success;
      }
      else {
        ERR_put_error(0x10,0,0x67,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_pkt.cc"
                      ,0x135);
        *(undefined1 *)out_consumed = 0x2f;
        in_local.size_._4_4_ = ssl_open_record_error;
      }
    }
    else {
      ERR_put_error(0x10,0,0xe1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_pkt.cc"
                    ,0x12f);
      *(undefined1 *)out_consumed = 10;
      in_local.size_._4_4_ = ssl_open_record_error;
    }
  }
  return in_local.size_._4_4_;
}

Assistant:

ssl_open_record_t tls_open_change_cipher_spec(SSL *ssl, size_t *out_consumed,
                                              uint8_t *out_alert,
                                              Span<uint8_t> in) {
  uint8_t type;
  Span<uint8_t> body;
  auto ret = tls_open_record(ssl, &type, &body, out_consumed, out_alert, in);
  if (ret != ssl_open_record_success) {
    return ret;
  }

  if (type != SSL3_RT_CHANGE_CIPHER_SPEC) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_RECORD);
    *out_alert = SSL_AD_UNEXPECTED_MESSAGE;
    return ssl_open_record_error;
  }

  if (body.size() != 1 || body[0] != SSL3_MT_CCS) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_CHANGE_CIPHER_SPEC);
    *out_alert = SSL_AD_ILLEGAL_PARAMETER;
    return ssl_open_record_error;
  }

  ssl_do_msg_callback(ssl, 0 /* read */, SSL3_RT_CHANGE_CIPHER_SPEC, body);
  return ssl_open_record_success;
}